

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O3

int mipmap_image(uchar *orig,int width,int height,int channels,uchar *resampled,int block_size_x,
                int block_size_y)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int v_block;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int block_area;
  int local_48;
  
  iVar3 = 0;
  iVar15 = 0;
  if ((((0 < block_size_y) && (iVar15 = 0, 0 < block_size_x)) &&
      (iVar15 = iVar3, resampled != (uchar *)0x0)) &&
     (((orig != (uchar *)0x0 && (0 < width)) && ((0 < height && (0 < channels)))))) {
    iVar15 = 0;
    uVar16 = (uint)width / (uint)block_size_x;
    uVar7 = 1;
    if (1 < (int)uVar16) {
      uVar7 = uVar16;
    }
    lVar5 = 0;
    do {
      lVar6 = lVar5 + 1;
      iVar3 = height - (int)lVar5 * block_size_y;
      if ((int)lVar6 * block_size_y <= height) {
        iVar3 = block_size_y;
      }
      local_48 = (int)lVar5 * uVar7;
      lVar5 = 0;
      iVar14 = iVar15;
      do {
        lVar1 = lVar5 + 1;
        uVar2 = width - (int)lVar5 * block_size_y;
        if (lVar1 * (ulong)(uint)block_size_x < (ulong)(uint)width ||
            lVar1 * (ulong)(uint)block_size_x - (ulong)(uint)width == 0) {
          uVar2 = block_size_x;
        }
        iVar10 = (int)(uVar2 * iVar3) >> 1;
        uVar17 = 0;
        iVar12 = iVar14;
        do {
          iVar4 = iVar10;
          if (0 < iVar3) {
            iVar8 = 0;
            iVar13 = iVar12;
            do {
              uVar11 = (ulong)uVar2;
              iVar9 = iVar13;
              if (0 < (int)uVar2) {
                do {
                  iVar4 = iVar4 + (uint)orig[iVar9];
                  uVar11 = uVar11 - 1;
                  iVar9 = iVar9 + channels;
                } while (uVar11 != 0);
              }
              iVar8 = iVar8 + 1;
              iVar13 = iVar13 + channels * width;
            } while (iVar8 < iVar3);
          }
          resampled[uVar17 + (long)(((int)lVar5 + local_48) * channels)] =
               (uchar)(iVar4 / (int)(uVar2 * iVar3));
          uVar17 = uVar17 + 1;
          iVar12 = iVar12 + 1;
        } while (uVar17 != (uint)channels);
        iVar14 = iVar14 + block_size_x * channels;
        lVar5 = lVar1;
      } while (lVar1 < (int)uVar16);
      iVar15 = iVar15 + channels * width * block_size_y;
      lVar5 = lVar6;
    } while (lVar6 < (int)((uint)height / (uint)block_size_y));
    iVar15 = 1;
  }
  return iVar15;
}

Assistant:

int
	mipmap_image
	(
		const unsigned char* const orig,
		int width, int height, int channels,
		unsigned char* resampled,
		int block_size_x, int block_size_y
	)
{
	int mip_width, mip_height;
	int i, j, c;

	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 1) || (orig == NULL) ||
		(resampled == NULL) ||
		(block_size_x < 1) || (block_size_y < 1) )
	{
		/*	nothing to do	*/
		return 0;
	}
	mip_width = width / block_size_x;
	mip_height = height / block_size_y;
	if( mip_width < 1 )
	{
		mip_width = 1;
	}
	if( mip_height < 1 )
	{
		mip_height = 1;
	}
	for( j = 0; j < mip_height; ++j )
	{
		for( i = 0; i < mip_width; ++i )
		{
			for( c = 0; c < channels; ++c )
			{
				const int index = (j*block_size_y)*width*channels + (i*block_size_x)*channels + c;
				int sum_value;
				int u,v;
				int u_block = block_size_x;
				int v_block = block_size_y;
				int block_area;
				/*	do a bit of checking so we don't over-run the boundaries
					(necessary for non-square textures!)	*/
				if( block_size_x * (i+1) > width )
				{
					u_block = width - i*block_size_y;
				}
				if( block_size_y * (j+1) > height )
				{
					v_block = height - j*block_size_y;
				}
				block_area = u_block*v_block;
				/*	for this pixel, see what the average
					of all the values in the block are.
					note: start the sum at the rounding value, not at 0	*/
				sum_value = block_area >> 1;
				for( v = 0; v < v_block; ++v )
				for( u = 0; u < u_block; ++u )
				{
					sum_value += orig[index + v*width*channels + u*channels];
				}
				resampled[j*mip_width*channels + i*channels + c] = sum_value / block_area;
			}
		}
	}
	return 1;
}